

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_add.c
# Opt level: O3

int linkedlist_add(s_linkedlist *linked_list,uint index,void *element)

{
  s_linkedlist_node *psVar1;
  s_linkedlist_node *psVar2;
  int iVar3;
  s_linkedlist_node *psVar4;
  
  if (index == 0) {
    iVar3 = linkedlist_add_front(linked_list,element);
    return iVar3;
  }
  psVar4 = linked_list->head;
  if (psVar4 != (s_linkedlist_node *)0x0) {
    iVar3 = index + 1;
    do {
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) {
        psVar2 = (s_linkedlist_node *)calloc(1,0x18);
        if (psVar2 == (s_linkedlist_node *)0x0) {
          return -1;
        }
        psVar2->element = element;
        psVar1 = psVar4->previous;
        psVar2->previous = psVar1;
        psVar2->next = psVar4;
        if (psVar1 != (s_linkedlist_node *)0x0) {
          psVar1->next = psVar2;
        }
        psVar4->previous = psVar2;
        linked_list->size = linked_list->size + 1;
        return 0;
      }
      psVar4 = psVar4->next;
    } while (psVar4 != (s_linkedlist_node *)0x0);
  }
  return -1;
}

Assistant:

int linkedlist_add(s_linkedlist *linked_list, unsigned int index, void *element) {
    s_linkedlist_node *node = linked_list->head;

    if (index == 0) {
        return linkedlist_add_front(linked_list, element);
    } else {
        while (node != NULL) {
            if (index == 0) {
                s_linkedlist_node *node_to_insert = malloc(sizeof(s_linkedlist_node));
                if (node_to_insert == NULL) {
                    return (LINKEDLIST_RETVAL_FAILURE);
                }

                memset(node_to_insert, 0, sizeof(s_linkedlist_node));

                node_to_insert->element  = element;
                node_to_insert->previous = node->previous;
                node_to_insert->next     = node;
                if (node->previous != NULL) {
                    node->previous->next = node_to_insert;
                }
                node->previous           = node_to_insert;

                linked_list->size += 1;
                return (LINKEDLIST_RETVAL_SUCCESS);
            }

            index -= 1;
            node = node->next;
        }
    }

    return (LINKEDLIST_RETVAL_FAILURE);
}